

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O2

Aig_Obj_t * Fra_ClausGetLiteral(Clu_Man_t *p,int *pVar2Id,int Lit)

{
  void *pvVar1;
  
  if (-1 < pVar2Id[Lit >> 1]) {
    pvVar1 = Vec_PtrEntry(p->pAig->vObjs,pVar2Id[Lit >> 1]);
    return (Aig_Obj_t *)((ulong)(Lit & 1) ^ *(ulong *)((long)pvVar1 + 0x28));
  }
  __assert_fail("NodeId >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                ,0x5f4,"Aig_Obj_t *Fra_ClausGetLiteral(Clu_Man_t *, int *, int)");
}

Assistant:

Aig_Obj_t * Fra_ClausGetLiteral( Clu_Man_t * p, int * pVar2Id, int Lit )
{
    Aig_Obj_t * pLiteral;
    int NodeId = pVar2Id[ lit_var(Lit) ];
    assert( NodeId >= 0 );
    pLiteral = (Aig_Obj_t *)Aig_ManObj( p->pAig, NodeId )->pData;
    return Aig_NotCond( pLiteral, lit_sign(Lit) );
}